

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex3::Run(UnitTest_lex3 *this)

{
  int iVar1;
  LexException *anon_var_0;
  int i;
  LexerWrapper lexer;
  LexerWrapper *pLVar2;
  allocator<char> local_1b9;
  string *in_stack_fffffffffffffe48;
  UnitTestBase *in_stack_fffffffffffffe50;
  allocator local_191;
  string local_190 [32];
  int local_170;
  string *in_stack_fffffffffffffe98;
  LexerWrapper *in_stack_fffffffffffffea0;
  string local_158 [344];
  
  pLVar2 = (LexerWrapper *)&stack0xfffffffffffffea7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"[==[long\nlong\nstring]==]\'string\'\"string\"[=[incomplete string]=",
             (allocator *)pLVar2);
  anon_unknown.dwarf_2562::LexerWrapper::LexerWrapper
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  for (local_170 = 0; local_170 < 3; local_170 = local_170 + 1) {
    iVar1 = anon_unknown.dwarf_2562::LexerWrapper::GetToken(pLVar2);
    if (iVar1 != 0x116) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,"\'lexer.GetToken() == luna::Token_String\'",&local_191);
      UnitTestBase::Error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
  }
  anon_unknown.dwarf_2562::LexerWrapper::GetToken(pLVar2);
  pLVar2 = (LexerWrapper *)&local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe48,
             "\'{ lexer.GetToken(); }\' has no luna::LexException",(allocator *)pLVar2);
  UnitTestBase::Error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::allocator<char>::~allocator(&local_1b9);
  anon_unknown.dwarf_2562::LexerWrapper::~LexerWrapper(pLVar2);
  return;
}

Assistant:

TEST_CASE(lex3)
{
    LexerWrapper lexer("[==[long\nlong\nstring]==]'string'\"string\""
                       "[=[incomplete string]=");
    for (int i = 0; i < 3; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_String);

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}